

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip-test.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_0::MockAsyncInputStream::tryRead
          (MockAsyncInputStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_> start;
  uchar *__src;
  size_t sVar1;
  PromiseNode *extraout_RDX;
  ArrayPtr<const_unsigned_char> AVar2;
  Promise<unsigned_long> PVar3;
  uchar *local_50;
  size_t local_48;
  size_t local_40;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_> local_38;
  size_t n;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  MockAsyncInputStream *this_local;
  
  maxBytes_local = maxBytes;
  minBytes_local = minBytes;
  buffer_local = buffer;
  this_local = this;
  local_38 = min<unsigned_long&,unsigned_long&>((unsigned_long *)((long)buffer + 0x18),&n);
  local_38 = max<unsigned_long&,unsigned_long&>(&local_38,&maxBytes_local);
  local_40 = ArrayPtr<const_unsigned_char>::size
                       ((ArrayPtr<const_unsigned_char> *)((long)buffer + 8));
  local_38 = min<unsigned_long&,unsigned_long>(&local_38,&local_40);
  sVar1 = minBytes_local;
  __src = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)((long)buffer + 8));
  memcpy((void *)sVar1,__src,local_38);
  start = local_38;
  sVar1 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)((long)buffer + 8));
  AVar2 = ArrayPtr<const_unsigned_char>::slice
                    ((ArrayPtr<const_unsigned_char> *)((long)buffer + 8),start,sVar1);
  local_50 = AVar2.ptr;
  *(uchar **)((long)buffer + 8) = local_50;
  local_48 = AVar2.size_;
  *(size_t *)((long)buffer + 0x10) = local_48;
  Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,local_38);
  PVar3.super_PromiseBase.node.ptr = extraout_RDX;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar3.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    // Clamp max read to blockSize.
    size_t n = kj::min(blockSize, maxBytes);

    // Unless that's less than minBytes -- in which case, use minBytes.
    n = kj::max(n, minBytes);

    // But also don't read more data than we have.
    n = kj::min(n, bytes.size());

    memcpy(buffer, bytes.begin(), n);
    bytes = bytes.slice(n, bytes.size());
    return n;
  }